

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

void irafswap4(char *string,int nbytes)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  
  pcVar6 = string + (uint)nbytes;
  for (; string < pcVar6; string = string + 4) {
    uVar1 = *(undefined4 *)string;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(
                                                  byte)((uint)uVar1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar1 >> 0x10),uVar1)) >>
                                                  0x20),uVar1) >> 0x18),
                                                  CONCAT12((char)((uint)uVar1 >> 8),(short)uVar1))
                                         >> 0x10),(short)uVar1) & 0xffff00ff00ff00ff;
    auVar7 = pshuflw(auVar7,auVar7,0x1b);
    sVar2 = auVar7._0_2_;
    sVar3 = auVar7._2_2_;
    sVar4 = auVar7._4_2_;
    sVar5 = auVar7._6_2_;
    *(uint *)string =
         CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar7[6] - (0xff < sVar5),
                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar7[4] - (0xff < sVar4),
                           CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar7[2] - (0xff < sVar3),
                                    (0 < sVar2) * (sVar2 < 0x100) * auVar7[0] - (0xff < sVar2))));
  }
  return;
}

Assistant:

static void irafswap4 (

char *string,	/* Address of Integer*4 or Real*4 vector */
int nbytes)	/* Number of bytes to reverse */

{
    char *sbyte, *slast;
    char temp0, temp1, temp2, temp3;

    slast = string + nbytes;
    sbyte = string;
    while (sbyte < slast) {
	temp3 = sbyte[0];
	temp2 = sbyte[1];
	temp1 = sbyte[2];
	temp0 = sbyte[3];
	sbyte[0] = temp0;
	sbyte[1] = temp1;
	sbyte[2] = temp2;
	sbyte[3] = temp3;
	sbyte = sbyte + 4;
	}

    return;
}